

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_array_expression_t *expr)

{
  typed_array_expression_t *expr_00;
  expression_type_t eVar1;
  variable_id_t vVar2;
  int iVar3;
  typed_var_expression_t *ptVar4;
  typed_expression_t *ptVar5;
  value_type_conflict2 local_a0;
  ulong local_98 [4];
  value_type_conflict2 local_78;
  vector<long,_std::allocator<long>_> *local_70;
  undefined1 local_68 [8];
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_expression_compiler;
  variable_size_t highoffset;
  int lowoffset;
  variable_id_t id;
  allocator<char> local_39;
  string local_38;
  typed_array_expression_t *local_18;
  typed_array_expression_t *expr_local;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  local_18 = expr;
  expr_local = (typed_array_expression_t *)this;
  eVar1 = typed_expression_t::type((typed_expression_t *)expr);
  if (eVar1 != EXPR_TYPE_CLKLVALUE) {
    eVar1 = typed_expression_t::type((typed_expression_t *)local_18);
    if (eVar1 != EXPR_TYPE_INTLVALUE) {
      eVar1 = typed_expression_t::type((typed_expression_t *)local_18);
      expr_00 = local_18;
      if (eVar1 != EXPR_TYPE_LOCALINTLVALUE) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"a lvalue",&local_39)
        ;
        invalid_expression(this,(typed_expression_t *)expr_00,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
      }
    }
  }
  ptVar4 = typed_array_expression_t::variable(local_18);
  vVar2 = typed_var_expression_t::id(ptVar4);
  rvalue_expression_compiler._bytecode_back_inserter.container._4_4_ = 0;
  ptVar4 = typed_array_expression_t::variable(local_18);
  iVar3 = (**(code **)(*(long *)&(ptVar4->super_typed_lvalue_expression_t).super_typed_expression_t
                      + 0x38))();
  rvalue_expression_compiler._bytecode_back_inserter.container._0_4_ = iVar3 - 1;
  local_70 = (this->_bytecode_back_inserter).container;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_68,(back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)local_70);
  local_78 = 5;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_78);
  local_98[3] = (ulong)vVar2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)(local_98 + 3));
  ptVar5 = typed_array_expression_t::offset(local_18);
  (**(code **)(*(long *)ptVar5 + 0x30))(ptVar5,local_68);
  local_98[2] = 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)(local_98 + 2));
  local_98[1] = 0;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)(local_98 + 1));
  local_98[0] = (ulong)(uint)rvalue_expression_compiler._bytecode_back_inserter.container;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)local_98);
  local_a0 = 0x13;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_a0);
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::~rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_68);
  return;
}

Assistant:

virtual void visit(tchecker::typed_array_expression_t const & expr)
  {
    if ((expr.type() != tchecker::EXPR_TYPE_CLKLVALUE) && (expr.type() != tchecker::EXPR_TYPE_INTLVALUE) &&
        (expr.type() != tchecker::EXPR_TYPE_LOCALINTLVALUE))
      invalid_expression(expr, "a lvalue");

    // offset bounds
    auto const id = expr.variable().id();
    auto const lowoffset = 0;
    auto const highoffset = expr.variable().size() - 1;

    // Write bytecode
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_expression_compiler(_bytecode_back_inserter);

    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = id;
    expr.offset().visit(rvalue_expression_compiler);
    _bytecode_back_inserter = tchecker::VM_FAILNOTIN;
    _bytecode_back_inserter = lowoffset;
    _bytecode_back_inserter = highoffset;
    _bytecode_back_inserter = tchecker::VM_SUM;
  }